

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

int xmlPatternMatch(xmlPatternPtr comp,xmlNodePtr node)

{
  xmlPatOp xVar1;
  xmlStepOpPtr pxVar2;
  _xmlNode *p_Var3;
  int iVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  xmlChar *str2;
  xmlChar *pxVar9;
  xmlStepOpPtr pxVar10;
  ulong uVar11;
  void *pvVar12;
  xmlNodePtr pxVar13;
  _xmlNode **pp_Var14;
  ulong local_40;
  
  iVar6 = -1;
  if (node != (xmlNodePtr)0x0 && comp != (xmlPatternPtr)0x0) {
    for (; comp != (xmlPatternPtr)0x0; comp = comp->next) {
      uVar8 = 0;
      local_40 = 0;
      pvVar12 = (void *)0x0;
      iVar6 = 0;
      pxVar13 = node;
LAB_00169c33:
      iVar7 = (int)uVar8;
      if (comp->nbStep <= iVar6) {
switchD_00169c67_caseD_0:
        if (pvVar12 == (void *)0x0) {
          return 1;
        }
        (*xmlFree)(pvVar12);
        return 1;
      }
      pxVar2 = comp->steps;
      if (XML_OP_ALL < pxVar2[iVar6].op) {
LAB_00169fd2:
        iVar6 = iVar6 + 1;
        goto LAB_00169c33;
      }
      pxVar10 = pxVar2 + iVar6;
      switch(pxVar2[iVar6].op) {
      case XML_OP_END:
        goto switchD_00169c67_caseD_0;
      case XML_OP_ROOT:
        if ((pxVar13->type != XML_NAMESPACE_DECL) &&
           (pxVar13 = pxVar13->parent,
           (pxVar13->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE)) goto LAB_00169fd2;
        break;
      case XML_OP_ELEM:
        if (pxVar13->type == XML_ELEMENT_NODE) {
LAB_00169d91:
          pxVar9 = pxVar10->value;
          if (pxVar9 != (xmlChar *)0x0) {
            if ((*pxVar9 != *pxVar13->name) ||
               (iVar4 = xmlStrEqual(pxVar9,pxVar13->name), iVar4 == 0)) break;
            if (pxVar13->ns == (xmlNs *)0x0) {
              if (pxVar10->value2 != (xmlChar *)0x0) break;
            }
            else {
              str2 = pxVar13->ns->href;
              if (str2 != (xmlChar *)0x0) {
                pxVar9 = pxVar10->value2;
                goto LAB_00169dde;
              }
            }
          }
          goto LAB_00169fd2;
        }
        break;
      case XML_OP_CHILD:
        if (((pxVar13->type < XML_DTD_NODE) &&
            ((0x2202U >> (pxVar13->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) &&
           (pxVar10->value != (xmlChar *)0x0)) {
          pp_Var14 = &pxVar13->children;
          while (p_Var3 = *pp_Var14, p_Var3 != (_xmlNode *)0x0) {
            if (p_Var3->type == XML_ELEMENT_NODE) {
              if ((*pxVar10->value == *p_Var3->name) &&
                 (iVar4 = xmlStrEqual(pxVar10->value,p_Var3->name), iVar4 != 0)) goto LAB_00169fd2;
            }
            pp_Var14 = &p_Var3->next;
          }
        }
        break;
      case XML_OP_ATTR:
        if ((pxVar13->type == XML_ATTRIBUTE_NODE) &&
           ((pxVar9 = pxVar10->value, pxVar9 == (xmlChar *)0x0 ||
            ((*pxVar9 == *pxVar13->name && (iVar4 = xmlStrEqual(pxVar9,pxVar13->name), iVar4 != 0)))
            ))) {
          pxVar9 = pxVar10->value2;
          if (pxVar13->ns != (xmlNs *)0x0) {
            if (pxVar9 == (xmlChar *)0x0) goto LAB_00169fd2;
            str2 = pxVar13->ns->href;
            goto LAB_00169e3c;
          }
joined_r0x00169e59:
          if (pxVar9 == (xmlChar *)0x0) goto LAB_00169fd2;
        }
        break;
      case XML_OP_PARENT:
        if (((XML_NAMESPACE_DECL < pxVar13->type) ||
            ((0x42200U >> (pxVar13->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) &&
           (pxVar13 = pxVar13->parent, pxVar13 != (xmlNodePtr)0x0)) goto LAB_00169d91;
        break;
      case XML_OP_ANCESTOR:
        if (pxVar10->value == (xmlChar *)0x0) {
          iVar6 = iVar6 + 1;
          if (pxVar2[iVar6].op != XML_OP_ELEM) {
            if (pxVar2[iVar6].op == XML_OP_ROOT) goto switchD_00169c67_caseD_0;
            break;
          }
          pxVar10 = pxVar2 + iVar6;
          if (pxVar10->value == (xmlChar *)0x0) {
            return -1;
          }
        }
        if ((pxVar13 != (xmlNodePtr)0x0) &&
           ((XML_NAMESPACE_DECL < pxVar13->type ||
            ((0x42200U >> (pxVar13->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)))) {
          do {
            while( true ) {
              do {
                do {
                  pxVar13 = pxVar13->parent;
                  if (pxVar13 == (xmlNodePtr)0x0) goto LAB_00169f52;
                } while (pxVar13->type != XML_ELEMENT_NODE);
              } while ((*pxVar10->value != *pxVar13->name) ||
                      (iVar4 = xmlStrEqual(pxVar10->value,pxVar13->name), iVar4 == 0));
              if (pxVar13->ns == (xmlNs *)0x0) break;
              pxVar9 = pxVar13->ns->href;
              if (((pxVar9 != (xmlChar *)0x0) && (pxVar10->value2 != (xmlChar *)0x0)) &&
                 (iVar4 = xmlStrEqual(pxVar10->value2,pxVar9), iVar4 != 0)) goto LAB_00169efa;
            }
          } while (pxVar10->value2 != (xmlChar *)0x0);
LAB_00169efa:
          xVar1 = pxVar10->op;
          iVar4 = (int)local_40;
          if (iVar4 < 1 || pvVar12 == (void *)0x0) {
            pvVar5 = (*xmlMalloc)(0x40);
            iVar7 = 0;
            uVar11 = 4;
          }
          else {
            pvVar5 = pvVar12;
            uVar11 = local_40;
            if (iVar4 <= iVar7) {
              pvVar5 = (*xmlRealloc)(pvVar12,(ulong)(uint)(iVar4 * 2) << 4);
              uVar11 = (ulong)(uint)(iVar4 * 2);
              if (pvVar5 == (void *)0x0) goto LAB_00169fd2;
            }
          }
          *(uint *)((long)pvVar5 + (long)iVar7 * 0x10) = iVar6 - (uint)(xVar1 != XML_OP_ANCESTOR);
          uVar8 = (ulong)(iVar7 + 1);
          *(xmlNodePtr *)((long)pvVar5 + (long)iVar7 * 0x10 + 8) = pxVar13;
          pvVar12 = pvVar5;
          local_40 = uVar11;
          goto LAB_00169fd2;
        }
        break;
      case XML_OP_NS:
        if (pxVar13->type == XML_ELEMENT_NODE) {
          if (pxVar13->ns == (xmlNs *)0x0) {
            pxVar9 = pxVar10->value;
            goto joined_r0x00169e59;
          }
          str2 = pxVar13->ns->href;
          if (str2 == (xmlChar *)0x0) goto LAB_00169fd2;
          pxVar9 = pxVar10->value;
LAB_00169dde:
          if (pxVar9 != (xmlChar *)0x0) {
LAB_00169e3c:
            iVar4 = xmlStrEqual(pxVar9,str2);
            if (iVar4 != 0) goto LAB_00169fd2;
          }
        }
        break;
      case XML_OP_ALL:
        if (pxVar13->type == XML_ELEMENT_NODE) goto LAB_00169fd2;
      }
LAB_00169f52:
      if (pvVar12 == (void *)0x0) goto LAB_00169fea;
      if (0 < iVar7) {
        uVar8 = (ulong)(iVar7 - 1);
        iVar6 = *(int *)((long)pvVar12 + uVar8 * 0x10);
        pxVar13 = *(xmlNodePtr *)((long)pvVar12 + uVar8 * 0x10 + 8);
        goto LAB_00169c33;
      }
      (*xmlFree)(pvVar12);
LAB_00169fea:
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int
xmlPatternMatch(xmlPatternPtr comp, xmlNodePtr node)
{
    int ret = 0;

    if ((comp == NULL) || (node == NULL))
        return(-1);

    while (comp != NULL) {
        ret = xmlPatMatch(comp, node);
	if (ret != 0)
	    return(ret);
	comp = comp->next;
    }
    return(ret);
}